

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

PerThreadSynch * absl::lts_20250127::Dequeue(PerThreadSynch *head,PerThreadSynch *pw)

{
  PerThreadSynch *y;
  bool bVar1;
  PerThreadSynch *pPVar2;
  
  pPVar2 = pw->next;
  y = pPVar2->next;
  pw->next = y;
  if (pPVar2 == head) {
    pPVar2 = (PerThreadSynch *)0x0;
    if (head != pw) {
      pPVar2 = pw;
    }
  }
  else {
    pPVar2 = head;
    if ((pw != head) && (bVar1 = MuEquivalentWaiter(pw,y), bVar1)) {
      if (y->skip == (PerThreadSynch *)0x0) {
        pw->skip = y;
      }
      else {
        pw->skip = y->skip;
      }
    }
  }
  return pPVar2;
}

Assistant:

static PerThreadSynch* Dequeue(PerThreadSynch* head, PerThreadSynch* pw) {
  PerThreadSynch* w = pw->next;
  pw->next = w->next;                 // snip w out of list
  if (head == w) {                    // we removed the head
    head = (pw == w) ? nullptr : pw;  // either emptied list, or pw is new head
  } else if (pw != head && MuEquivalentWaiter(pw, pw->next)) {
    // pw can skip to its new successor
    if (pw->next->skip !=
        nullptr) {  // either skip to its successors skip target
      pw->skip = pw->next->skip;
    } else {  // or to pw's successor
      pw->skip = pw->next;
    }
  }
  return head;
}